

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

void advance_engine<trng::yarn4>(yarn4 *r1,yarn4 *r2,long N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0 < N) {
    do {
      iVar3 = (r1->S).r[0];
      iVar1 = (r1->S).r[1];
      iVar2 = (r1->S).r[2];
      uVar4 = (long)(r1->S).r[3] * (long)(r1->P).a[3] + (long)(r1->P).a[2] * (long)iVar2 +
              (long)(r1->P).a[1] * (long)iVar1 + (long)(r1->P).a[0] * (long)iVar3;
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0x1fffffffc;
      if (uVar5 < 0x1fffffffc) {
        uVar4 = uVar5;
      }
      (r1->S).r[3] = iVar2;
      (r1->S).r[2] = iVar1;
      (r1->S).r[1] = iVar3;
      uVar5 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar5 = uVar4;
      }
      iVar3 = (int)uVar5 + -0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        iVar3 = (int)uVar5;
      }
      (r1->S).r[0] = iVar3;
      iVar3 = (r2->S).r[0];
      iVar1 = (r2->S).r[1];
      iVar2 = (r2->S).r[2];
      uVar4 = (long)(r2->S).r[3] * (long)(r2->P).a[3] + (long)(r2->P).a[2] * (long)iVar2 +
              (long)(r2->P).a[1] * (long)iVar1 + (long)(r2->P).a[0] * (long)iVar3;
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0x1fffffffc;
      if (uVar5 < 0x1fffffffc) {
        uVar4 = uVar5;
      }
      uVar5 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar5 = uVar4;
      }
      (r2->S).r[3] = iVar2;
      (r2->S).r[2] = iVar1;
      (r2->S).r[1] = iVar3;
      iVar3 = (int)uVar5 + -0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        iVar3 = (int)uVar5;
      }
      (r2->S).r[0] = iVar3;
      N = N + -1;
    } while (N != 0);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}